

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

DdNode * cuddUniqueInterZdd(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  int *piVar1;
  DdSubtable *pDVar2;
  uint uVar3;
  DdSubtable *pDVar4;
  DdNode *pDVar5;
  int iVar6;
  int iVar7;
  DdNode **ppDVar8;
  DdNode *pDVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  DdNode **ppDVar14;
  ulong uVar15;
  
  if ((index < unique->sizeZ) || (iVar7 = cuddResizeTableZdd(unique,index), iVar7 != 0)) {
    pDVar4 = unique->subtableZ;
    uVar13 = unique->permZ[index];
    uVar10 = (ulong)uVar13;
    pDVar2 = pDVar4 + uVar10;
    if (pDVar4[uVar10].maxKeys < pDVar4[uVar10].keys) {
      if ((unique->gcEnabled == 0) ||
         ((unique->deadZ <= unique->minDead && (pDVar2->dead * 10 <= pDVar4[uVar10].keys * 9)))) {
        if (unique->looseUpTo < unique->slots) {
          unique->minDead = unique->slots;
          unique->gcFrac = 1.0;
        }
        if (uVar13 == 0x7fffffff) {
          __assert_fail("i != CUDD_MAXINDEX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cudd/cuddTable.c"
                        ,0x98e,"void ddRehashZdd(DdManager *, int)");
        }
        uVar3 = pDVar4[(int)uVar13].slots;
        iVar7 = pDVar4[(int)uVar13].shift;
        ppDVar14 = pDVar4[(int)uVar13].nodelist;
        uVar15 = (ulong)uVar3;
        do {
          iVar6 = (int)uVar15;
          uVar11 = iVar6 * 2;
          uVar15 = (ulong)uVar11;
          iVar7 = iVar7 + -1;
          uVar12 = iVar6 << 3;
        } while (uVar12 < pDVar4[(int)uVar13].keys);
        ppDVar8 = (DdNode **)malloc((ulong)uVar11 * 8);
        if (ppDVar8 == (DdNode **)0x0) {
          uVar15 = 0;
          fprintf((FILE *)unique->err,"Unable to resize ZDD subtable %d for lack of memory.\n",
                  uVar10);
          cuddGarbageCollect(unique,1);
          uVar10 = (ulong)(uint)unique->sizeZ;
          if (unique->sizeZ < 1) {
            uVar10 = uVar15;
          }
          for (; uVar10 * 0x38 - uVar15 != 0; uVar15 = uVar15 + 0x38) {
            piVar1 = (int *)((long)&unique->subtableZ->maxKeys + uVar15);
            *piVar1 = *piVar1 << 1;
          }
        }
        else {
          pDVar4[(int)uVar13].nodelist = ppDVar8;
          pDVar4[(int)uVar13].slots = uVar11;
          pDVar4[(int)uVar13].shift = iVar7;
          pDVar4[(int)uVar13].maxKeys = uVar12;
          for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
            ppDVar8[uVar10] = (DdNode *)0x0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            pDVar9 = ppDVar14[uVar10];
            while (pDVar9 != (DdNode *)0x0) {
              pDVar5 = pDVar9->next;
              uVar15 = *(ulong *)((long)&pDVar9->type + 8);
              uVar13 = (((uint)uVar15 & 1) + *(int *)((uVar15 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)*(ulong *)&pDVar9->type & 1) +
                       *(int *)((*(ulong *)&pDVar9->type & 0xfffffffffffffffe) + 0x20) * 2) *
                       0xc00005) * 0x40f1f9 >> ((byte)iVar7 & 0x1f);
              pDVar9->next = ppDVar8[(int)uVar13];
              ppDVar8[(int)uVar13] = pDVar9;
              pDVar9 = pDVar5;
            }
          }
          free(ppDVar14);
          unique->memused = unique->memused + (ulong)(uVar11 - uVar3) * 8;
          unique->slots = unique->slots + (uVar11 - uVar3);
          ddFixLimits(unique);
        }
      }
      else {
        cuddGarbageCollect(unique,1);
      }
    }
    ppDVar8 = pDVar2->nodelist +
              (int)((((uint)E & 1) + *(int *)(((ulong)E & 0xfffffffffffffffe) + 0x20) * 2 +
                    (((uint)T & 1) + *(int *)(((ulong)T & 0xfffffffffffffffe) + 0x20) * 2) *
                    0xc00005) * 0x40f1f9 >> ((byte)pDVar2->shift & 0x1f));
    ppDVar14 = ppDVar8;
    while (pDVar9 = *ppDVar14, pDVar9 != (DdNode *)0x0) {
      if (((pDVar9->type).kids.T == T) && ((pDVar9->type).kids.E == E)) {
        if (pDVar9->ref != 0) {
          return pDVar9;
        }
        cuddReclaimZdd(unique,pDVar9);
        return pDVar9;
      }
      ppDVar14 = &pDVar9->next;
    }
    if ((unique->autoDynZ == 0) ||
       (unique->keysZ - (unique->countDead & unique->deadZ) < unique->nextDyn)) {
      unique->keysZ = unique->keysZ + 1;
      pDVar2->keys = pDVar2->keys + 1;
      pDVar9 = cuddAllocNode(unique);
      if (pDVar9 != (DdNode *)0x0) {
        pDVar9->index = index;
        (pDVar9->type).kids.T = T;
        (pDVar9->type).kids.E = E;
        pDVar9->next = *ppDVar8;
        *ppDVar8 = pDVar9;
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        return pDVar9;
      }
    }
    else {
      iVar7 = Cudd_zddReduceHeap(unique,unique->autoMethodZ,10);
      if (iVar7 == 0) {
        unique->reordered = 2;
      }
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddUniqueInterZdd(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdSubtable *subtable;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->sizeZ) {
        if (!cuddResizeTableZdd(unique,index)) return(NULL);
    }

    level = unique->permZ[index];
    subtable = &(unique->subtableZ[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddIZ(unique,T->index));
    assert(level < (unsigned) cuddIZ(unique,Cudd_Regular(E)->index));
#endif

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled && ((unique->deadZ > unique->minDead) ||
        (10 * subtable->dead > 9 * subtable->keys))) {  /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            ddRehashZdd(unique,(int)level);
        }
    }

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    looking = nodelist[pos];

    while (looking != NULL) {
        if (cuddT(looking) == T && cuddE(looking) == E) {
            if (looking->ref == 0) {
                cuddReclaimZdd(unique,looking);
            }
            return(looking);
        }
        looking = looking->next;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDynZ &&
    unique->keysZ - (unique->deadZ & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_zddReduceHeap(unique,unique->autoMethodZ,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    unique->keysZ++;
    subtable->keys++;

    looking = cuddAllocNode(unique);
    if (looking == NULL) return(NULL);
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = nodelist[pos];
    nodelist[pos] = looking;
    cuddRef(T);
    cuddRef(E);

    return(looking);

}